

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O2

void deqp::gles3::Functional::createRandomCaseGroup
               (TestCaseGroup *parentGroup,Context *context,char *groupName,char *description,
               BufferMode bufferMode,deUint32 features,int numCases,deUint32 baseSeed)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  TestNode *node;
  RandomUniformBlockCase *this;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  int local_70;
  int local_6c;
  TestNode *local_68;
  undefined8 local_60;
  undefined8 local_58;
  string local_50;
  
  local_58 = CONCAT44(in_register_0000008c,features);
  local_60 = CONCAT44(in_register_00000084,bufferMode);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,groupName,description);
  local_68 = node;
  tcu::TestNode::addChild(&parentGroup->super_TestNode,node);
  local_6c = tcu::CommandLine::getBaseSeed(context->m_testCtx->m_cmdLine);
  local_6c = local_6c + baseSeed;
  for (local_70 = 0; local_70 < numCases; local_70 = local_70 + 1) {
    this = (RandomUniformBlockCase *)operator_new(0xe8);
    testCtx = context->m_testCtx;
    renderCtx = context->m_renderCtx;
    de::toString<int>(&local_50,&local_70);
    deqp::gls::RandomUniformBlockCase::RandomUniformBlockCase
              (this,testCtx,renderCtx,GLSL_VERSION_300_ES,local_50._M_dataplus._M_p,
               glcts::fixed_sample_locations_values + 1,(BufferMode)local_60,(deUint32)local_58,
               local_70 + local_6c);
    tcu::TestNode::addChild(local_68,(TestNode *)this);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

static void createRandomCaseGroup (tcu::TestCaseGroup* parentGroup, Context& context, const char* groupName, const char* description, UniformBlockCase::BufferMode bufferMode, deUint32 features, int numCases, deUint32 baseSeed)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(context.getTestContext(), groupName, description);
	parentGroup->addChild(group);

	baseSeed += (deUint32)context.getTestContext().getCommandLine().getBaseSeed();

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new RandomUniformBlockCase(context.getTestContext(), context.getRenderContext(), glu::GLSL_VERSION_300_ES,
												   de::toString(ndx).c_str(), "", bufferMode, features, (deUint32)ndx+baseSeed));
}